

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O1

void __thiscall ear::PolarExtent::~PolarExtent(PolarExtent *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  PolarExtentCore *pPVar1;
  
  free((this->ctx).xs);
  free((this->ctx).ys);
  free((this->ctx).zs);
  free((this->ctx).panning_results);
  free((this->ctx).summed_panning_results);
  free((this->ctx).results);
  free((this->pvsMax).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->pvsMin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  this_00 = (this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pPVar1 = (this->core_impl)._M_t.
           super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>.
           _M_t.
           super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
           .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl;
  if (pPVar1 != (PolarExtentCore *)0x0) {
    (*pPVar1->_vptr_PolarExtentCore[1])();
  }
  (this->core_impl)._M_t.
  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>._M_t.
  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
  super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl = (PolarExtentCore *)0x0;
  return;
}

Assistant:

PolarExtent::~PolarExtent() {
    xsimd::aligned_free(ctx.xs);
    xsimd::aligned_free(ctx.ys);
    xsimd::aligned_free(ctx.zs);
    xsimd::aligned_free(ctx.panning_results);
    xsimd::aligned_free(ctx.summed_panning_results);
    xsimd::aligned_free(ctx.results);
  }